

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu2.c
# Opt level: O0

MPP_RET vdpu2_h264d_reset(void *hal)

{
  H264dHalCtx_t *p_hal;
  MPP_RET ret;
  void *hal_local;
  
  if (hal == (void *)0x0) {
    if ((hal_h264d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_h264d_vdpu_reg","input empty(%d).\n",(char *)0x0,0x433);
    }
  }
  else {
    memset(*(void **)((long)hal + 0x40),0,0x1150);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu2_h264d_reset(void *hal)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    memset(p_hal->priv, 0, sizeof(H264dVdpuPriv_t));

__RETURN:
    return ret = MPP_OK;
}